

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexStdLayoutOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_TILE_MODE GVar1;
  anon_struct_8_44_94931171_for_Info aVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  GMM_PLATFORM_INFO *pGVar8;
  undefined4 extraout_var;
  ulong uVar9;
  uint32_t *puVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  GMM_GFX_SIZE_T GVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint32_t local_84;
  uint32_t local_80;
  anon_struct_12_3_eb34d150 Element;
  GMM_GFX_SIZE_T local_60;
  uint local_38;
  
  GVar15 = (pReqInfo->StdLayout).Offset;
  puVar10 = &pReqInfo->ArrayIndex;
  if (GVar15 == 0xffffffffffffffff) {
    puVar10 = &pTexInfo->ArraySize;
  }
  uVar18 = ((uint)(pTexInfo->Type == RESOURCE_CUBE) * 5 + 1) * *puVar10;
  aVar2 = (pTexInfo->Flags).Info;
  iVar3 = 0x10000;
  if (((ulong)aVar2 & 0x104000000000) == 0) {
    iVar3 = (uint)(((ulong)aVar2 & 0x81000000000) != 0) << 0xc;
  }
  pGVar8 = GmmGetPlatformInfo(this->pGmmLibContext);
  uVar4 = pTexInfo->BitsPerPixel;
  GVar1 = pTexInfo->TileMode;
  GetCompressionBlockDimensions(this,pTexInfo->Format,&local_84,&local_80,&Element.Width);
  uVar4 = (pGVar8->TileInfo[GVar1].LogicalTileWidth / (uVar4 >> 3)) * local_84;
  uVar12 = local_80 * pGVar8->TileInfo[GVar1].LogicalTileHeight;
  uVar13 = Element.Width * pGVar8->TileInfo[GVar1].LogicalTileDepth;
  if (uVar18 == 0) {
    local_38 = pReqInfo->MipLevel;
  }
  else {
    local_38 = (pTexInfo->Alignment).MipTailStartLod;
    if (pTexInfo->MaxLod < local_38) {
      local_38 = pTexInfo->MaxLod;
    }
  }
  (pReqInfo->StdLayout).Offset = 0;
  lVar17 = 0;
  lVar11 = 0;
  local_60 = 0;
  for (uVar16 = 0; uVar16 <= local_38; uVar16 = uVar16 + 1) {
    Element._4_8_ = lVar17;
    iVar5 = (*this->_vptr_GmmTextureCalc[0x18])(this,pTexInfo,(ulong)uVar16);
    uVar9 = CONCAT44(extraout_var,iVar5);
    uVar6 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar16);
    uVar7 = (*this->_vptr_GmmTextureCalc[0x1a])(this,pTexInfo,(ulong)uVar16);
    if (uVar4 != 0) {
      uVar9 = (uVar9 + (uVar4 - 1)) / (ulong)uVar4;
    }
    if (uVar12 != 0) {
      uVar6 = (uVar6 + (uVar12 - 1)) / uVar12;
    }
    if (uVar13 != 0) {
      uVar7 = (uVar7 + (uVar13 - 1)) / uVar13;
    }
    if (uVar16 <= (pTexInfo->Alignment).MipTailStartLod) {
      (pReqInfo->StdLayout).Offset = (pReqInfo->StdLayout).Offset + lVar11;
    }
    uVar14 = (int)uVar9 * iVar3;
    uVar9 = (ulong)(uVar6 * uVar14);
    if (uVar16 == pReqInfo->MipLevel) {
      local_60 = (pReqInfo->StdLayout).Offset;
      (pReqInfo->StdLayout).TileRowPitch = (ulong)uVar14;
      (pReqInfo->StdLayout).TileDepthPitch = uVar9;
    }
    lVar11 = uVar7 * uVar9;
    lVar17 = Element._4_8_ + uVar9;
  }
  uVar4 = pReqInfo->Slice;
  if (GVar15 == 0xffffffffffffffff) {
    GVar15 = (pReqInfo->StdLayout).Offset;
  }
  else {
    GVar15 = (pReqInfo->StdLayout).Offset;
    if ((pTexInfo->Alignment).MipTailStartLod <= pReqInfo->MipLevel) {
      uVar12 = (*this->_vptr_GmmTextureCalc[9])();
      lVar11 = (ulong)uVar12 + (GVar15 + lVar11) * (ulong)uVar18 + (pReqInfo->StdLayout).Offset;
      goto LAB_001bae94;
    }
  }
  lVar11 = (GVar15 + lVar11) * (ulong)uVar18 + local_60;
LAB_001bae94:
  lVar17 = lVar17 * (ulong)uVar4;
  if ((ulong)uVar4 == 0) {
    lVar17 = 0;
  }
  (pReqInfo->StdLayout).Offset = lVar17 + lVar11;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexStdLayoutOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                         GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t ReqArrayIndex;
    bool     NeedSurfaceSize = false;

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.TiledYf);
    __GMM_ASSERT(
    (pTexInfo->Type == RESOURCE_2D) ||
    (pTexInfo->Type == RESOURCE_3D) ||
    (pTexInfo->Type == RESOURCE_CUBE));
    __GMM_ASSERT(GmmIsPlanar(pTexInfo->Format) == false); // Planar not support

    if(pReqInfo->StdLayout.Offset == -1) // Special Req for Surface Size
    {
        NeedSurfaceSize = true;
        ReqArrayIndex   = // TODO(Medium): Add planar support.
        (pTexInfo->ArraySize * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }
    else
    {
        ReqArrayIndex =
        (pReqInfo->ArrayIndex * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }

    {
        uint32_t TileSize = 0;

        // TileYs (64) and TileYf (4)
        if(GMM_IS_64KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(64);
        }
        else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(4);
        }

        const GMM_PLATFORM_INFO *pPlatform       = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
        uint32_t                 BytesPerElement = pTexInfo->BitsPerPixel / CHAR_BIT;
        GMM_TILE_MODE            TileMode        = pTexInfo->TileMode;
        struct
        {
            uint32_t Width, Height, Depth;
        } Element, Tile;

        __GMM_ASSERT(TileMode < GMM_TILE_MODES);

        GetCompressionBlockDimensions(
        pTexInfo->Format,
        &Element.Width,
        &Element.Height,
        &Element.Depth);

        Tile.Width =
        (pPlatform->TileInfo[TileMode].LogicalTileWidth / BytesPerElement) *
        Element.Width;

        Tile.Height =
        pPlatform->TileInfo[TileMode].LogicalTileHeight *
        Element.Height;

        Tile.Depth =
        pPlatform->TileInfo[TileMode].LogicalTileDepth *
        Element.Depth;

        {
            GMM_GFX_ADDRESS TargetLodOffset = 0;
            GMM_GFX_SIZE_T  PrevMipSize     = 0;
            GMM_GFX_SIZE_T  SliceOffset     = 0;
            GMM_GFX_SIZE_T  SlicePitch      = 0;
            uint32_t        Lod;
            uint32_t        EffectiveMaxLod =
            (ReqArrayIndex == 0) ?
            pReqInfo->MipLevel :
            GFX_MIN(pTexInfo->MaxLod, pTexInfo->Alignment.MipTailStartLod);

            pReqInfo->StdLayout.Offset = 0;
            for(Lod = 0; Lod <= EffectiveMaxLod; Lod++)
            {
                GMM_GFX_SIZE_T MipWidth  = GmmTexGetMipWidth(pTexInfo, Lod);
                uint32_t       MipHeight = GmmTexGetMipHeight(pTexInfo, Lod);
                uint32_t       MipDepth  = GmmTexGetMipDepth(pTexInfo, Lod);

                uint32_t MipCols = GFX_ULONG_CAST(
                GFX_CEIL_DIV(
                MipWidth,
                Tile.Width));
                uint32_t MipRows =
                GFX_CEIL_DIV(
                MipHeight,
                Tile.Height);
                uint32_t MipDepthTiles =
                GFX_CEIL_DIV(
                MipDepth,
                Tile.Depth);
                uint32_t RowPitch   = MipCols * TileSize; // Bytes from one tile row to the next.
                uint32_t DepthPitch = RowPitch * MipRows; // Bytes from one depth slice of tiles to the next.

                if(Lod <= pTexInfo->Alignment.MipTailStartLod)
                {
                    pReqInfo->StdLayout.Offset += PrevMipSize;
                }

                if(Lod == pReqInfo->MipLevel)
                {
                    TargetLodOffset = pReqInfo->StdLayout.Offset;

                    pReqInfo->StdLayout.TileRowPitch   = RowPitch;
                    pReqInfo->StdLayout.TileDepthPitch = DepthPitch;
                }

                PrevMipSize = (GMM_GFX_SIZE_T)DepthPitch * MipDepthTiles;
                SlicePitch += DepthPitch;
            }

            if(pReqInfo->Slice > 0)
            {
                SliceOffset = SlicePitch * pReqInfo->Slice;
            }

            if(!NeedSurfaceSize && pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod)
            {
                pReqInfo->StdLayout.Offset += (ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize)) +
                                              GetMipTailByteOffset(pTexInfo, pReqInfo->MipLevel);
            }
            else
            {
                pReqInfo->StdLayout.Offset = ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize) +
                                             TargetLodOffset;
            }

            pReqInfo->StdLayout.Offset += SliceOffset;
        }
    }

    return GMM_SUCCESS;
}